

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

char * rv_alloc(int i)

{
  Bigint *pBVar1;
  char *pcVar2;
  int iVar3;
  int k;
  
  k = 0;
  for (iVar3 = 4; (long)iVar3 + 0x18U <= (ulong)(uint)i; iVar3 = iVar3 * 2) {
    k = k + 1;
  }
  pBVar1 = Balloc(k);
  if (pBVar1 == (Bigint *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    *(int *)&pBVar1->next = k;
    pcVar2 = (char *)((long)&pBVar1->next + 4);
  }
  return pcVar2;
}

Assistant:

static char *
rv_alloc(int i)
{
    int j, k, *r;

    j = sizeof(ULong);
    for(k = 0;
        sizeof(Bigint) - sizeof(ULong) - sizeof(int) + j <= (unsigned)i;
        j <<= 1)
        k++;
    r = (int*)Balloc(k);
    if (r == NULL)
        return NULL;
    *r = k;
    return (char *)(r+1);
}